

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-aes-impl.c
# Opt level: O1

uint32_t ndn_lite_default_aes_parse_unpadding_size(uint8_t *plaintext_value,uint32_t plaintext_size)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  byte *pbVar4;
  bool bVar5;
  byte bVar6;
  
  pbVar4 = plaintext_value + ((ulong)plaintext_size - 1);
  bVar6 = *pbVar4;
  lVar2 = 0;
  do {
    bVar1 = "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10"[lVar2];
    if (bVar6 == bVar1) {
      bVar6 = 1;
      if (1 < bVar1) {
        bVar6 = bVar1;
      }
      bVar5 = true;
      do {
        if (*pbVar4 != bVar1) {
          bVar5 = false;
        }
        bVar6 = bVar6 - 1;
      } while (bVar6 != 0);
      uVar3 = 0;
      if (bVar5) {
        uVar3 = ~(uint)lVar2;
      }
      return plaintext_size + uVar3;
    }
    lVar2 = lVar2 + 1;
    pbVar4 = pbVar4 + -1;
  } while (lVar2 != 0x10);
  return plaintext_size;
}

Assistant:

uint32_t
ndn_lite_default_aes_parse_unpadding_size(uint8_t* plaintext_value, uint32_t plaintext_size)
{
  for (uint8_t i = 0; i < TC_AES_BLOCK_SIZE; i++)
    if (*(plaintext_value + plaintext_size - 1) == byte[i]) {
      bool satisfy = true;
      for (uint8_t j = 0; j < byte[i]; j++) {
        if (*(plaintext_value + plaintext_size - 1 - i) != byte[i]) {
          satisfy = false;
        }
      }
      if (satisfy) {
        return plaintext_size - i - 1;
      }
      else {
        return plaintext_size;
      }
    }
  return plaintext_size;
}